

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testInit(LengthOfVectorAndMatrixTest *this)

{
  vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
  *this_00;
  GLuint row;
  GLuint GVar1;
  GLuint row_3;
  GLuint col;
  uint uVar2;
  testCase test_case;
  
  this_00 = &this->m_test_cases;
  for (GVar1 = 2; GVar1 != 5; GVar1 = GVar1 + 1) {
    test_case.m_type = UINT;
    test_case.m_n_cols = 1;
    test_case.m_n_rows = GVar1;
    std::
    vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
    ::push_back(this_00,&test_case);
  }
  for (GVar1 = 2; GVar1 != 5; GVar1 = GVar1 + 1) {
    test_case.m_type = INT;
    test_case.m_n_cols = 1;
    test_case.m_n_rows = GVar1;
    std::
    vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
    ::push_back(this_00,&test_case);
  }
  for (GVar1 = 2; GVar1 != 5; GVar1 = GVar1 + 1) {
    test_case.m_type = FLOAT;
    test_case.m_n_cols = 1;
    test_case.m_n_rows = GVar1;
    std::
    vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
    ::push_back(this_00,&test_case);
  }
  for (uVar2 = 2; uVar2 != 5; uVar2 = uVar2 + 1) {
    for (GVar1 = 2; GVar1 != 5; GVar1 = GVar1 + 1) {
      test_case._0_8_ = (ulong)uVar2 << 0x20;
      test_case.m_n_rows = GVar1;
      std::
      vector<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase,_std::allocator<gl4cts::GLSL420Pack::LengthOfVectorAndMatrixTest::testCase>_>
      ::push_back(this_00,&test_case);
    }
  }
  return true;
}

Assistant:

bool LengthOfVectorAndMatrixTest::testInit()
{
	/* Vectors */
	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::UINT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::INT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	for (GLuint row = 2; row <= 4; ++row)
	{
		testCase test_case = { Utils::FLOAT, 1 /* n_cols */, row };

		m_test_cases.push_back(test_case);
	}

	/* Matrices */
	for (GLuint col = 2; col <= 4; ++col)
	{
		for (GLuint row = 2; row <= 4; ++row)
		{
			testCase test_case = { Utils::FLOAT, col, row };

			m_test_cases.push_back(test_case);
		}
	}

	return true;
}